

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
* __thiscall chaiscript::Type_Conversions::thread_cache(Type_Conversions *this)

{
  size_type sVar1;
  __int_type _Var2;
  undefined1 local_28 [8];
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *cache;
  Type_Conversions *this_local;
  
  l._8_8_ = detail::threading::
            Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
            ::operator*((Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
                         *)(this + 0xa0));
  sVar1 = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::size((set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                  *)l._8_8_);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)(this + 0x98));
  if (sVar1 != _Var2) {
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)local_28,(mutex_type *)this);
    std::
    set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::operator=((set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                 *)l._8_8_,
                (set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
                 *)(this + 0x68));
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_28);
  }
  return (set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          *)l._8_8_;
}

Assistant:

const std::set<const std::type_info *, Less_Than> &thread_cache() const {
      auto &cache = *m_thread_cache;
      if (cache.size() != m_num_types) {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        cache = m_convertableTypes;
      }

      return cache;
    }